

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

iterator * __thiscall NNTreeImpl::last(iterator *__return_storage_ptr__,NNTreeImpl *this)

{
  QPDFObjectHandle local_30;
  undefined1 local_19;
  NNTreeImpl *local_18;
  NNTreeImpl *this_local;
  iterator *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (NNTreeImpl *)__return_storage_ptr__;
  NNTreeIterator::NNTreeIterator(__return_storage_ptr__,this);
  QPDFObjectHandle::QPDFObjectHandle(&local_30,&this->oh);
  NNTreeIterator::deepen(__return_storage_ptr__,&local_30,false,true);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  return __return_storage_ptr__;
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::last()
{
    iterator result(*this);
    result.deepen(this->oh, false, true);
    return result;
}